

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::PreserveBackBufferCase::iterate(PreserveBackBufferCase *this)

{
  Functions *gl;
  ResultCollector *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EGLSurface draw;
  TestLog *this_01;
  bool condition;
  deUint32 dVar2;
  GLenum GVar3;
  Library *egl;
  Surface *pSVar4;
  void *__buf;
  void *__buf_00;
  IVec2 oldEglSize;
  IVec2 newEglSize;
  Surface newSurface;
  Surface oldSurface;
  ScopedCurrentContext currentCtx;
  int local_2c0 [2];
  string local_2b8;
  string local_298;
  int local_278 [2];
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  Surface local_1f0;
  Surface local_1d8;
  ScopedCurrentContext local_1c0;
  LogImageSet local_1b0;
  IVec2 local_170;
  IVec2 local_168;
  IVec2 local_160;
  IVec2 local_158;
  LogImage local_150;
  LogImage local_c0;
  
  egl = EglTestContext::getLibrary((this->super_ResizeTest).super_TestCase.m_eglTestCtx);
  draw = ((this->super_ResizeTest).m_surface.
          super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.ptr
         )->m_surface;
  eglu::ScopedCurrentContext::ScopedCurrentContext
            (&local_1c0,egl,(this->super_ResizeTest).m_display,draw,draw,
             ((this->super_ResizeTest).m_context.
              super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>.m_data
             .ptr)->m_context);
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface,0x3093,0x3094);
  dVar2 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar2,
                   "surfaceAttrib(m_display, **m_surface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0x186);
  GVar3 = (*(this->super_ResizeTest).m_gl.getError)();
  glu::checkError(GVar3,"GL state erroneous upon initialization!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                  ,0x188);
  eglu::getSurfaceSize
            ((eglu *)local_2c0,egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  gl = &(this->super_ResizeTest).m_gl;
  local_158.m_data[0] = local_2c0[0];
  local_158.m_data[1] = local_2c0[1];
  initSurface(gl,&local_158);
  (*(this->super_ResizeTest).m_gl.finish)();
  GVar3 = (*(this->super_ResizeTest).m_gl.getError)();
  glu::checkError(GVar3,"glFinish() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                  ,399);
  local_160.m_data[0] = local_2c0[0];
  local_160.m_data[1] = local_2c0[1];
  readSurface(&local_1d8,gl,&local_160);
  (*egl->_vptr_Library[0x31])
            (egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  local_168.m_data = *&(this->super_ResizeTest).m_newSize.m_data;
  ResizeTest::resize(&this->super_ResizeTest,&local_168);
  (*egl->_vptr_Library[0x31])
            (egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  dVar2 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar2,"eglSwapBuffers()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0x197);
  eglu::getSurfaceSize
            ((eglu *)local_278,egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  local_170.m_data[0] = local_278[0];
  local_170.m_data[1] = local_278[1];
  readSurface(&local_1f0,gl,&local_170);
  this_01 = (this->super_ResizeTest).m_log;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Corner comparison","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"Comparing old and new surfaces at all corners","");
  tcu::LogImageSet::LogImageSet(&local_1b0,&local_298,&local_210);
  tcu::TestLog::startImageSet
            (this_01,local_1b0.m_name._M_dataplus._M_p,local_1b0.m_description._M_dataplus._M_p);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Before resizing","");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Before resizing","");
  pSVar4 = &local_1d8;
  tcu::LogImage::LogImage(&local_150,&local_2b8,&local_230,pSVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_150,(int)this_01,__buf,(size_t)pSVar4);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"After resizing","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"After resizing","");
  pSVar4 = &local_1f0;
  tcu::LogImage::LogImage(&local_c0,&local_250,&local_270,pSVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_c0,(int)this_01,__buf_00,(size_t)pSVar4);
  tcu::TestLog::endImageSet(this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_description._M_dataplus._M_p != &local_c0.m_description.field_2) {
    operator_delete(local_c0.m_description._M_dataplus._M_p,
                    local_c0.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_name._M_dataplus._M_p != &local_c0.m_name.field_2) {
    operator_delete(local_c0.m_name._M_dataplus._M_p,
                    local_c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.m_description._M_dataplus._M_p != &local_150.m_description.field_2) {
    operator_delete(local_150.m_description._M_dataplus._M_p,
                    local_150.m_description.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_150.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_150.m_name._M_dataplus._M_p,
                    local_150.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.m_description._M_dataplus._M_p != &local_1b0.m_description.field_2) {
    operator_delete(local_1b0.m_description._M_dataplus._M_p,
                    local_1b0.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.m_name._M_dataplus._M_p != &local_1b0.m_name.field_2) {
    operator_delete(local_1b0.m_name._M_dataplus._M_p,
                    local_1b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  condition = compareCorners(&local_1d8,&local_1f0);
  local_150.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "Resizing the native window changed the contents of the EGL surface","");
  this_00 = &(this->super_ResizeTest).m_status;
  tcu::ResultCollector::checkResult
            (this_00,condition,QP_TEST_RESULT_QUALITY_WARNING,&local_150.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_150.m_name._M_dataplus._M_p,
                    local_150.m_name.field_2._M_allocated_capacity + 1);
  }
  tcu::Surface::~Surface(&local_1f0);
  tcu::Surface::~Surface(&local_1d8);
  tcu::ResultCollector::setTestContextResult
            (this_00,(this->super_ResizeTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx
            );
  eglu::ScopedCurrentContext::~ScopedCurrentContext(&local_1c0);
  return STOP;
}

Assistant:

IterateResult PreserveBackBufferCase::iterate (void)
{
	const Library&			egl			= m_eglTestCtx.getLibrary();
	ScopedCurrentContext	currentCtx	(egl, m_display, **m_surface, **m_surface, **m_context);

	EGLU_CHECK_CALL(egl, surfaceAttrib(m_display, **m_surface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "GL state erroneous upon initialization!");

	{
		const IVec2 oldEglSize = eglu::getSurfaceSize(egl, m_display, **m_surface);
		initSurface(m_gl, oldEglSize);

		m_gl.finish();
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glFinish() failed");

		{
			const Surface oldSurface = readSurface(m_gl, oldEglSize);

			egl.swapBuffers(m_display, **m_surface);
			this->resize(m_newSize);
			egl.swapBuffers(m_display, **m_surface);
			EGLU_CHECK_MSG(egl, "eglSwapBuffers()");

			{
				const IVec2		newEglSize	= eglu::getSurfaceSize(egl, m_display, **m_surface);
				const Surface	newSurface	= readSurface(m_gl, newEglSize);

				m_log << TestLog::ImageSet("Corner comparison",
										   "Comparing old and new surfaces at all corners")
					  << TestLog::Image("Before resizing", "Before resizing", oldSurface)
					  << TestLog::Image("After resizing", "After resizing", newSurface)
					  << TestLog::EndImageSet;

				m_status.checkResult(compareCorners(oldSurface, newSurface),
									 QP_TEST_RESULT_QUALITY_WARNING,
									 "Resizing the native window changed the contents of "
									 "the EGL surface");
			}
		}
	}

	m_status.setTestContextResult(m_testCtx);
	return STOP;
}